

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::anon_unknown_61::ValidateRayTracingPipelineCreateInfo
               (IRenderDevice *pDevice,RayTracingPipelineStateCreateInfo *CreateInfo)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RAY_TRACING_CAP_FLAGS RVar11;
  int iVar12;
  undefined4 extraout_var;
  long lVar13;
  char *local_250;
  char *local_210;
  char *local_1f0;
  char *local_1d0;
  char *local_1c0;
  char *local_1b8;
  bool local_1a9;
  char *local_1a8;
  char *local_1a0;
  Char *local_198;
  Char *local_190;
  Char *local_188;
  char *local_180;
  char *local_178;
  undefined8 *local_170;
  RayTracingProceduralHitShaderGroup *Group_2;
  Char *pCStack_160;
  Uint32 i_2;
  Char *local_158;
  char *local_150;
  char *local_148;
  undefined8 *local_140;
  RayTracingTriangleHitShaderGroup *Group_1;
  Char *pCStack_130;
  Uint32 i_1;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110 [3];
  undefined8 *local_f8;
  RayTracingGeneralShaderGroup *Group;
  undefined1 auStack_e8 [4];
  Uint32 i;
  anon_class_16_2_acfc9a23 VerifyShaderGroupName;
  unordered_set<Diligent::HashMapStringKey,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<Diligent::HashMapStringKey>_>
  GroupNames;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  RenderDeviceInfo *local_58;
  PipelineStateDesc *PSODesc;
  RayTracingProperties *RTProps;
  RenderDeviceInfo *DeviceInfo;
  RayTracingPipelineStateCreateInfo *CreateInfo_local;
  IRenderDevice *pDevice_local;
  
  DeviceInfo = (RenderDeviceInfo *)CreateInfo;
  CreateInfo_local = (RayTracingPipelineStateCreateInfo *)pDevice;
  iVar12 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
  RTProps = (RayTracingProperties *)CONCAT44(extraout_var,iVar12);
  lVar13 = (**(code **)((CreateInfo_local->super_PipelineStateCreateInfo).PSODesc.
                        super_DeviceObjectAttribs.Name + 200))();
  PSODesc = (PipelineStateDesc *)(lVar13 + 0xb8);
  local_58 = DeviceInfo;
  if ((char)(DeviceInfo->APIVersion).Minor != '\x03') {
    local_60 = GetPipelineTypeString((PIPELINE_TYPE)(DeviceInfo->APIVersion).Minor);
    lVar13._0_4_ = local_58->Type;
    lVar13._4_4_ = (local_58->APIVersion).Major;
    if (lVar13 == 0) {
      local_1a0 = "";
    }
    else {
      local_1a0 = *(char **)local_58;
    }
    local_68 = local_1a0;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[35]>
              (false,"ValidateRayTracingPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,700,(char (*) [16])"Description of ",&local_60,(char (*) [7])0xc0e54c,&local_68,
               (char (*) [15])"\' is invalid: ",(char (*) [35])"Pipeline type must be RAY_TRACING.")
    ;
  }
  if (((char)RTProps->MaxInstancesPerTLAS == '\0') ||
     (RVar11 = Diligent::operator&(*(RAY_TRACING_CAP_FLAGS *)
                                    &(PSODesc->ResourceLayout).ImmutableSamplers,
                                   RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS),
     RVar11 == RAY_TRACING_CAP_FLAG_NONE)) {
    local_70 = GetPipelineTypeString((PIPELINE_TYPE)(local_58->APIVersion).Minor);
    lVar3._0_4_ = local_58->Type;
    lVar3._4_4_ = (local_58->APIVersion).Major;
    if (lVar3 == 0) {
      local_1a8 = "";
    }
    else {
      local_1a8 = *(char **)local_58;
    }
    local_78 = local_1a8;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[49]>
              (false,"ValidateRayTracingPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2bf,(char (*) [16])"Description of ",&local_70,(char (*) [7])0xc0e54c,&local_78,
               (char (*) [15])"\' is invalid: ",
               (char (*) [49])"Standalone ray tracing shaders are not supported");
  }
  ValidatePipelineResourceSignatures
            ((PipelineStateCreateInfo *)DeviceInfo,(IRenderDevice *)CreateInfo_local);
  ValidatePipelineResourceLayoutDesc
            ((PipelineStateDesc *)local_58,(DeviceFeatures *)&RTProps->ShaderGroupBaseAlignment);
  if (RTProps->MaxRecursionDepth == 2) {
    lVar4._0_1_ = DeviceInfo[1].Features.NativeFence;
    lVar4._1_1_ = DeviceInfo[1].Features.TileShaders;
    lVar4._2_1_ = DeviceInfo[1].Features.TransferQueueTimestampQueries;
    lVar4._3_1_ = DeviceInfo[1].Features.VariableRateShading;
    lVar4._4_1_ = DeviceInfo[1].Features.SparseResources;
    lVar4._5_1_ = DeviceInfo[1].Features.SubpassFramebufferFetch;
    lVar4._6_1_ = DeviceInfo[1].Features.TextureComponentSwizzle;
    lVar4._7_1_ = DeviceInfo[1].Features.TextureSubresourceViews;
    local_1a9 = false;
    if (lVar4 != 0) {
      local_1a9 = **(char **)&DeviceInfo[1].Features.NativeFence != '\0';
    }
    if (local_1a9 != ((short)(DeviceInfo->MaxShaderVersion).MSL.Major != 0)) {
      local_80 = GetPipelineTypeString((PIPELINE_TYPE)(local_58->APIVersion).Minor);
      lVar5._0_4_ = local_58->Type;
      lVar5._4_4_ = (local_58->APIVersion).Major;
      if (lVar5 == 0) {
        local_1b8 = "";
      }
      else {
        local_1b8 = *(char **)local_58;
      }
      local_88 = local_1b8;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[87]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x2c7,(char (*) [16])"Description of ",&local_80,(char (*) [7])0xc0e54c,&local_88,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [87])
                 "pShaderRecordName must not be null if RayTracingPipeline.ShaderRecordSize is not zero."
                );
    }
  }
  if (*(uint *)&(PSODesc->super_DeviceObjectAttribs).Name <
      (uint)*(byte *)((long)&(DeviceInfo->MaxShaderVersion).MSL.Major + 2)) {
    local_90 = GetPipelineTypeString((PIPELINE_TYPE)(local_58->APIVersion).Minor);
    lVar6._0_4_ = local_58->Type;
    lVar6._4_4_ = (local_58->APIVersion).Major;
    if (lVar6 == 0) {
      local_1c0 = "";
    }
    else {
      local_1c0 = *(char **)local_58;
    }
    local_98 = local_1c0;
    GroupNames._M_h._M_single_bucket._4_4_ =
         (uint)*(byte *)((long)&(DeviceInfo->MaxShaderVersion).MSL.Major + 2);
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[20],unsigned_int,char[25],unsigned_int,char[3]>
              (false,"ValidateRayTracingPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2cd,(char (*) [16])"Description of ",&local_90,(char (*) [7])0xc0e54c,&local_98,
               (char (*) [15])"\' is invalid: ",(char (*) [20])"MaxRecursionDepth (",
               (uint *)((long)&GroupNames._M_h._M_single_bucket + 4),
               (char (*) [25])") exceeds device limit (",(uint *)PSODesc,(char (*) [3])0xccce78);
  }
  std::
  unordered_set<Diligent::HashMapStringKey,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<Diligent::HashMapStringKey>_>
  ::unordered_set((unordered_set<Diligent::HashMapStringKey,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<Diligent::HashMapStringKey>_>
                   *)&VerifyShaderGroupName.GroupNames);
  _auStack_e8 = local_58;
  VerifyShaderGroupName.PSODesc = (PipelineStateDesc *)&VerifyShaderGroupName.GroupNames;
  for (Group._4_4_ = 0; Group._4_4_ < DeviceInfo[1].APIVersion.Minor; Group._4_4_ = Group._4_4_ + 1)
  {
    local_f8 = (undefined8 *)(*(long *)(DeviceInfo + 1) + (ulong)Group._4_4_ * 0x10);
    ValidateRayTracingPipelineCreateInfo::anon_class_16_2_acfc9a23::operator()
              ((anon_class_16_2_acfc9a23 *)auStack_e8,"pGeneralShaders",Group._4_4_,
               (char *)*local_f8);
    if (local_f8[1] == 0) {
      local_110[0] = GetPipelineTypeString((PIPELINE_TYPE)(local_58->APIVersion).Minor);
      lVar7._0_4_ = local_58->Type;
      lVar7._4_4_ = (local_58->APIVersion).Major;
      if (lVar7 == 0) {
        local_1d0 = "";
      }
      else {
        local_1d0 = *(char **)local_58;
      }
      local_118 = local_1d0;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[17],unsigned_int,char[28]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x2e7,(char (*) [16])"Description of ",local_110,(char (*) [7])0xc0e54c,&local_118
                 ,(char (*) [15])"\' is invalid: ",(char (*) [17])"pGeneralShaders[",
                 (uint *)((long)&Group + 4),(char (*) [28])"].pShader must not be null.");
    }
    lVar13 = (**(code **)(*(long *)local_f8[1] + 0x20))();
    iVar12 = *(int *)(lVar13 + 8);
    if (((iVar12 != 0x100) && (iVar12 != 0x200)) && (iVar12 != 0x2000)) {
      local_120 = GetPipelineTypeString((PIPELINE_TYPE)(local_58->APIVersion).Minor);
      lVar8._0_4_ = local_58->Type;
      lVar8._4_4_ = (local_58->APIVersion).Major;
      if (lVar8 == 0) {
        local_1f0 = "";
      }
      else {
        local_1f0 = *(char **)local_58;
      }
      local_128 = local_1f0;
      lVar13 = (**(code **)(*(long *)local_f8[1] + 0x20))();
      pCStack_130 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(lVar13 + 8));
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char_const*,char[53]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x2ef,(char (*) [16])"Description of ",&local_120,(char (*) [7])0xc0e54c,
                 &local_128,(char (*) [15])"\' is invalid: ",&stack0xfffffffffffffed0,
                 (char (*) [53])" is not a valid type for ray tracing general shader.");
    }
  }
  for (Group_1._4_4_ = 0; uVar1._0_1_ = DeviceInfo[1].Features.TimestampQueries,
      uVar1._1_1_ = DeviceInfo[1].Features.PipelineStatisticsQueries,
      uVar1._2_1_ = DeviceInfo[1].Features.DurationQueries,
      uVar1._3_1_ = DeviceInfo[1].Features.DepthBiasClamp, Group_1._4_4_ < uVar1;
      Group_1._4_4_ = Group_1._4_4_ + 1) {
    local_140 = (undefined8 *)
                (*(long *)&DeviceInfo[1].Features.ComputeShaders + (ulong)Group_1._4_4_ * 0x18);
    ValidateRayTracingPipelineCreateInfo::anon_class_16_2_acfc9a23::operator()
              ((anon_class_16_2_acfc9a23 *)auStack_e8,"pTriangleHitShaders",Group_1._4_4_,
               (char *)*local_140);
    if (local_140[1] == 0) {
      local_148 = GetPipelineTypeString((PIPELINE_TYPE)(local_58->APIVersion).Minor);
      lVar9._0_4_ = local_58->Type;
      lVar9._4_4_ = (local_58->APIVersion).Major;
      if (lVar9 == 0) {
        local_210 = "";
      }
      else {
        local_210 = *(char **)local_58;
      }
      local_150 = local_210;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[21],unsigned_int,char[38]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x2fa,(char (*) [16])"Description of ",&local_148,(char (*) [7])0xc0e54c,
                 &local_150,(char (*) [15])"\' is invalid: ",(char (*) [21])"pTriangleHitShaders[",
                 (uint *)((long)&Group_1 + 4),(char (*) [38])"].pClosestHitShader must not be null."
                );
    }
    if ((local_140[1] != 0) &&
       (lVar13 = (**(code **)(*(long *)local_140[1] + 0x20))(), *(int *)(lVar13 + 8) != 0x400)) {
      lVar13 = (**(code **)(*(long *)local_140[1] + 0x20))();
      local_158 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(lVar13 + 8));
      LogError<true,char_const*,char[26],char[33],char[8]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x2fc,&local_158,(char (*) [26])" is not a valid type for ",
                 (char (*) [33])"ray tracing triangle closest hit",(char (*) [8])0xcc12ef);
    }
    if ((local_140[2] != 0) &&
       (lVar13 = (**(code **)(*(long *)local_140[2] + 0x20))(), *(int *)(lVar13 + 8) != 0x800)) {
      lVar13 = (**(code **)(*(long *)local_140[2] + 0x20))();
      pCStack_160 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(lVar13 + 8));
      LogError<true,char_const*,char[26],char[29],char[8]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x2fd,&stack0xfffffffffffffea0,(char (*) [26])" is not a valid type for ",
                 (char (*) [29])"ray tracing triangle any hit",(char (*) [8])0xcc12ef);
    }
  }
  for (Group_2._4_4_ = 0; uVar2._0_1_ = DeviceInfo[1].Features.ShaderInputOutput16,
      uVar2._1_1_ = DeviceInfo[1].Features.ShaderInt8,
      uVar2._2_1_ = DeviceInfo[1].Features.ResourceBuffer8BitAccess,
      uVar2._3_1_ = DeviceInfo[1].Features.UniformBuffer8BitAccess, Group_2._4_4_ < uVar2;
      Group_2._4_4_ = Group_2._4_4_ + 1) {
    local_170 = (undefined8 *)
                (*(long *)&DeviceInfo[1].Features.TextureCompressionBC + (ulong)Group_2._4_4_ * 0x20
                );
    ValidateRayTracingPipelineCreateInfo::anon_class_16_2_acfc9a23::operator()
              ((anon_class_16_2_acfc9a23 *)auStack_e8,"pProceduralHitShaders",Group_2._4_4_,
               (char *)*local_170);
    if (local_170[1] == 0) {
      local_178 = GetPipelineTypeString((PIPELINE_TYPE)(local_58->APIVersion).Minor);
      lVar10._0_4_ = local_58->Type;
      lVar10._4_4_ = (local_58->APIVersion).Major;
      if (lVar10 == 0) {
        local_250 = "";
      }
      else {
        local_250 = *(char **)local_58;
      }
      local_180 = local_250;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],unsigned_int,char[40]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x307,(char (*) [16])"Description of ",&local_178,(char (*) [7])0xc0e54c,
                 &local_180,(char (*) [15])"\' is invalid: ",(char (*) [23])"pProceduralHitShaders["
                 ,(uint *)((long)&Group_2 + 4),
                 (char (*) [40])"].pIntersectionShader must not be null.");
    }
    if ((local_170[1] != 0) &&
       (lVar13 = (**(code **)(*(long *)local_170[1] + 0x20))(), *(int *)(lVar13 + 8) != 0x1000)) {
      lVar13 = (**(code **)(*(long *)local_170[1] + 0x20))();
      local_188 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(lVar13 + 8));
      LogError<true,char_const*,char[26],char[36],char[8]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x309,&local_188,(char (*) [26])" is not a valid type for ",
                 (char (*) [36])"ray tracing procedural intersection",(char (*) [8])0xcc12ef);
    }
    if ((local_170[2] != 0) &&
       (lVar13 = (**(code **)(*(long *)local_170[2] + 0x20))(), *(int *)(lVar13 + 8) != 0x400)) {
      lVar13 = (**(code **)(*(long *)local_170[2] + 0x20))();
      local_190 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(lVar13 + 8));
      LogError<true,char_const*,char[26],char[35],char[8]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x30a,&local_190,(char (*) [26])" is not a valid type for ",
                 (char (*) [35])"ray tracing procedural closest hit",(char (*) [8])0xcc12ef);
    }
    if ((local_170[3] != 0) &&
       (lVar13 = (**(code **)(*(long *)local_170[3] + 0x20))(), *(int *)(lVar13 + 8) != 0x800)) {
      lVar13 = (**(code **)(*(long *)local_170[3] + 0x20))();
      local_198 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(lVar13 + 8));
      LogError<true,char_const*,char[26],char[31],char[8]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x30b,&local_198,(char (*) [26])" is not a valid type for ",
                 (char (*) [31])"ray tracing procedural any hit",(char (*) [8])0xcc12ef);
    }
  }
  std::
  unordered_set<Diligent::HashMapStringKey,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<Diligent::HashMapStringKey>_>
  ::~unordered_set((unordered_set<Diligent::HashMapStringKey,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<Diligent::HashMapStringKey>_>
                    *)&VerifyShaderGroupName.GroupNames);
  return;
}

Assistant:

void ValidateRayTracingPipelineCreateInfo(const IRenderDevice*                     pDevice,
                                          const RayTracingPipelineStateCreateInfo& CreateInfo) noexcept(false)
{
    const RenderDeviceInfo&     DeviceInfo = pDevice->GetDeviceInfo();
    const RayTracingProperties& RTProps    = pDevice->GetAdapterInfo().RayTracing;
    const PipelineStateDesc&    PSODesc    = CreateInfo.PSODesc;
    if (PSODesc.PipelineType != PIPELINE_TYPE_RAY_TRACING)
        LOG_PSO_ERROR_AND_THROW("Pipeline type must be RAY_TRACING.");

    if (!DeviceInfo.Features.RayTracing || (RTProps.CapFlags & RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS) == 0)
        LOG_PSO_ERROR_AND_THROW("Standalone ray tracing shaders are not supported");

    ValidatePipelineResourceSignatures(CreateInfo, pDevice);
    ValidatePipelineResourceLayoutDesc(PSODesc, DeviceInfo.Features);

    if (DeviceInfo.Type == RENDER_DEVICE_TYPE_D3D12)
    {
        if ((CreateInfo.pShaderRecordName != nullptr && *CreateInfo.pShaderRecordName != '\0') != (CreateInfo.RayTracingPipeline.ShaderRecordSize > 0))
            LOG_PSO_ERROR_AND_THROW("pShaderRecordName must not be null if RayTracingPipeline.ShaderRecordSize is not zero.");
    }

    if (CreateInfo.RayTracingPipeline.MaxRecursionDepth > RTProps.MaxRecursionDepth)
    {
        LOG_PSO_ERROR_AND_THROW("MaxRecursionDepth (", Uint32{CreateInfo.RayTracingPipeline.MaxRecursionDepth},
                                ") exceeds device limit (", RTProps.MaxRecursionDepth, ").");
    }

    std::unordered_set<HashMapStringKey> GroupNames;

    auto VerifyShaderGroupName = [&](const char* MemberName, // "pGeneralShaders", "pTriangleHitShaders", or "pProceduralHitShaders"
                                     Uint32      GroupInd,
                                     const char* GroupName) {
        if (GroupName == nullptr)
            LOG_PSO_ERROR_AND_THROW(MemberName, "[", GroupInd, "].Name must not be null.");

        if (GroupName[0] == '\0')
            LOG_PSO_ERROR_AND_THROW(MemberName, "[", GroupInd, "].Name must not be empty.");

        const bool IsNewName = GroupNames.emplace(HashMapStringKey{GroupName}).second;
        if (!IsNewName)
            LOG_PSO_ERROR_AND_THROW(MemberName, "[", GroupInd, "].Name ('", GroupName, "') has already been assigned to another group. All group names must be unique.");
    };

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        const RayTracingGeneralShaderGroup& Group = CreateInfo.pGeneralShaders[i];

        VerifyShaderGroupName("pGeneralShaders", i, Group.Name);

        if (Group.pShader == nullptr)
            LOG_PSO_ERROR_AND_THROW("pGeneralShaders[", i, "].pShader must not be null.");

        switch (Group.pShader->GetDesc().ShaderType)
        {
            case SHADER_TYPE_RAY_GEN:
            case SHADER_TYPE_RAY_MISS:
            case SHADER_TYPE_CALLABLE: break;
            default:
                LOG_PSO_ERROR_AND_THROW(GetShaderTypeLiteralName(Group.pShader->GetDesc().ShaderType), " is not a valid type for ray tracing general shader.");
        }
    }

    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        const RayTracingTriangleHitShaderGroup& Group = CreateInfo.pTriangleHitShaders[i];

        VerifyShaderGroupName("pTriangleHitShaders", i, Group.Name);

        if (Group.pClosestHitShader == nullptr)
            LOG_PSO_ERROR_AND_THROW("pTriangleHitShaders[", i, "].pClosestHitShader must not be null.");

        VALIDATE_SHADER_TYPE(Group.pClosestHitShader, SHADER_TYPE_RAY_CLOSEST_HIT, "ray tracing triangle closest hit")
        VALIDATE_SHADER_TYPE(Group.pAnyHitShader, SHADER_TYPE_RAY_ANY_HIT, "ray tracing triangle any hit")
    }

    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        const RayTracingProceduralHitShaderGroup& Group = CreateInfo.pProceduralHitShaders[i];

        VerifyShaderGroupName("pProceduralHitShaders", i, Group.Name);

        if (Group.pIntersectionShader == nullptr)
            LOG_PSO_ERROR_AND_THROW("pProceduralHitShaders[", i, "].pIntersectionShader must not be null.");

        VALIDATE_SHADER_TYPE(Group.pIntersectionShader, SHADER_TYPE_RAY_INTERSECTION, "ray tracing procedural intersection")
        VALIDATE_SHADER_TYPE(Group.pClosestHitShader, SHADER_TYPE_RAY_CLOSEST_HIT, "ray tracing procedural closest hit")
        VALIDATE_SHADER_TYPE(Group.pAnyHitShader, SHADER_TYPE_RAY_ANY_HIT, "ray tracing procedural any hit")
    }
}